

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O2

void player_pickup_gold(player *p)

{
  uint32_t *puVar1;
  short sVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  bool bVar3;
  _Bool _Var4;
  bool bVar5;
  int iVar6;
  object *poVar7;
  object_kind *poVar8;
  char *pcVar9;
  uint type;
  object *obj;
  int iVar10;
  char name [30];
  char buf [100];
  
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  poVar7 = square_object(cave,grid);
  bVar3 = true;
  iVar10 = 0;
  bVar5 = false;
  do {
    do {
      obj = poVar7;
      if (obj == (object *)0x0) {
        if (iVar10 != 0) {
          strnfmt(buf,100,"You have found %ld gold pieces worth of ",(long)iVar10);
          pcVar9 = "treasures";
          if (bVar3) {
            pcVar9 = name;
          }
          my_strcat(buf,pcVar9,100);
          my_strcat(buf,".",100);
          if (bVar5) {
            type = 0x52;
            if (199 < iVar10) {
              type = (599 < iVar10) + 0x53;
            }
            msgt(type,"%s",buf);
          }
          p->au = p->au + iVar10;
          puVar1 = &p->upkeep->redraw;
          *puVar1 = *puVar1 | 0x100;
        }
        return;
      }
      poVar7 = obj->next;
      poVar8 = lookup_kind((uint)obj->tval,(uint)obj->sval);
      _Var4 = tval_is_money(obj);
    } while (poVar8 == (object_kind *)0x0 || !_Var4);
    pcVar9 = poVar8->name;
    if (iVar10 == 0) {
LAB_00131e37:
      my_strcpy(name,pcVar9,0x1e);
    }
    else {
      iVar6 = strcmp(pcVar9,name);
      if (iVar6 == 0) goto LAB_00131e37;
      bVar3 = false;
    }
    _Var4 = ignore_item_ok(p,obj);
    sVar2 = obj->pval;
    if (obj->known != (object *)0x0) {
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      square_delete_object((chunk_conflict *)p->cave,grid_00,obj->known,false,false);
    }
    bVar5 = (bool)(bVar5 | !_Var4);
    iVar10 = iVar10 + sVar2;
    grid_01.x = (p->grid).x;
    grid_01.y = (p->grid).y;
    square_delete_object(cave,grid_01,obj,false,false);
  } while( true );
}

Assistant:

static void player_pickup_gold(struct player *p)
{
	int32_t total_gold = 0L;
	char name[30] = "";

	struct object *obj = square_object(cave, p->grid), *next;

	int sound_msg;
	bool verbal = false;
	bool at_most_one = true;

	/* Pick up all the ordinary gold objects */
	while (obj) {
		struct object_kind *kind = NULL;

		/* Get next object */
		next = obj->next;

		/* Ignore if not legal treasure */
		kind = lookup_kind(obj->tval, obj->sval);
		if (!tval_is_money(obj) || !kind) {
			obj = next;
			continue;
		}

		/* Multiple types if we have a second name, otherwise record the name */
		if (total_gold && !streq(kind->name, name))
			at_most_one = false;
		else
			my_strcpy(name, kind->name, sizeof(name));

		/* Remember whether feedback message is in order */
		if (!ignore_item_ok(p, obj))
			verbal = true;

		/* Increment total value */
		total_gold += (int32_t)obj->pval;

		/* Delete the gold */
		if (obj->known) {
			square_delete_object(p->cave, p->grid, obj->known, false, false);
		}
		square_delete_object(cave, p->grid, obj, false, false);
		obj = next;
	}

	/* Pick up the gold, if present */
	if (total_gold) {
		char buf[100];

		/* Build a message */
		(void)strnfmt(buf, sizeof(buf),
			"You have found %ld gold pieces worth of ", (long)total_gold);

		/* One treasure type.. */
		if (at_most_one)
			my_strcat(buf, name, sizeof(buf));
		/* ... or more */
		else
			my_strcat(buf, "treasures", sizeof(buf));
		my_strcat(buf, ".", sizeof(buf));

		/* Determine which sound to play */
		if      (total_gold < 200) sound_msg = MSG_MONEY1;
		else if (total_gold < 600) sound_msg = MSG_MONEY2;
		else                       sound_msg = MSG_MONEY3;

		/* Display the message */
		if (verbal)
			msgt(sound_msg, "%s", buf);

		/* Add gold to purse */
		p->au += total_gold;

		/* Redraw gold */
		p->upkeep->redraw |= (PR_GOLD);
	}
}